

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O3

void Ssw_RarManInitialize(Ssw_RarMan_t *p,Vec_Int_t *vInit)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Aig_Man_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  word *pwVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  
  iVar1 = p->pAig->pConst1->Id;
  if (p->pAig->vObjs->nSize <= iVar1) {
LAB_006adcd1:
    __assert_fail("Id < Aig_ManObjNumMax(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                  ,0x53,"word *Ssw_RarObjSim(Ssw_RarMan_t *, int)");
  }
  iVar2 = p->pPars->nWords;
  if (0 < (long)iVar2) {
    memset(p->pObjData + iVar1 * iVar2,0xff,(long)iVar2 << 3);
  }
  Ssw_RarManAssingRandomPis(p);
  if (vInit == (Vec_Int_t *)0x0) {
    pAVar6 = p->pAig;
    iVar1 = pAVar6->nRegs;
    if (0 < (long)iVar1) {
      pVVar7 = pAVar6->vCos;
      iVar2 = pAVar6->nTruePos;
      lVar13 = 0;
      do {
        if ((((iVar2 < 0) || (lVar14 = lVar13 + iVar2, pVVar7->nSize <= lVar14)) ||
            (uVar12 = pAVar6->nTruePis + (int)lVar13, (int)uVar12 < 0)) ||
           (pAVar6->vCis->nSize <= (int)uVar12)) goto LAB_006adcb2;
        iVar4 = *(int *)((long)pVVar7->pArray[lVar14] + 0x24);
        iVar10 = pAVar6->vObjs->nSize;
        if ((iVar10 <= iVar4) ||
           (iVar5 = *(int *)((long)pAVar6->vCis->pArray[uVar12] + 0x24), iVar10 <= iVar5))
        goto LAB_006adcd1;
        uVar12 = p->pPars->nWords;
        if (0 < (int)uVar12) {
          pwVar8 = p->pObjData;
          uVar15 = 0;
          do {
            pwVar8[(long)(int)(iVar5 * uVar12) + uVar15] =
                 pwVar8[(long)(int)(iVar4 * uVar12) + uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar12 != uVar15);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != iVar1);
    }
  }
  else {
    iVar1 = vInit->nSize;
    pAVar6 = p->pAig;
    uVar12 = pAVar6->nRegs;
    uVar3 = p->pPars->nWords;
    if (iVar1 != uVar3 * uVar12) {
      __assert_fail("Vec_IntSize(vInit) == Saig_ManRegNum(p->pAig) * p->pPars->nWords",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                    ,0x1ae,"void Ssw_RarManInitialize(Ssw_RarMan_t *, Vec_Int_t *)");
    }
    if (0 < (int)uVar12) {
      pVVar7 = pAVar6->vCis;
      iVar2 = pAVar6->nTruePis;
      lVar13 = 0;
      uVar15 = 0;
      do {
        if ((iVar2 < 0) || (lVar14 = uVar15 + (long)iVar2, pVVar7->nSize <= lVar14)) {
LAB_006adcb2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar4 = *(int *)((long)pVVar7->pArray[lVar14] + 0x24);
        if (pAVar6->vObjs->nSize <= iVar4) goto LAB_006adcd1;
        if (0 < (int)uVar3) {
          pwVar8 = p->pObjData;
          uVar11 = uVar15 & 0xffffffff;
          uVar9 = 0;
          lVar14 = lVar13;
          do {
            iVar10 = (int)uVar11;
            if ((iVar10 < 0) || (iVar1 <= iVar10)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            pwVar8[(long)(int)(iVar4 * uVar3) + uVar9] =
                 -(ulong)(*(int *)((long)vInit->pArray + lVar14) != 0);
            uVar9 = uVar9 + 1;
            lVar14 = lVar14 + (ulong)uVar12 * 4;
            uVar11 = (ulong)(iVar10 + uVar12);
          } while (uVar3 != uVar9);
        }
        uVar15 = uVar15 + 1;
        lVar13 = lVar13 + 4;
      } while (uVar15 != uVar12);
    }
  }
  return;
}

Assistant:

void Ssw_RarManInitialize( Ssw_RarMan_t * p, Vec_Int_t * vInit )
{
    Aig_Obj_t * pObj, * pObjLi;
    word * pSim, * pSimLi;
    int w, i;
    // constant
    pObj = Aig_ManConst1( p->pAig );
    pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
    for ( w = 0; w < p->pPars->nWords; w++ )
        pSim[w] = ~(word)0;
    // primary inputs
    Ssw_RarManAssingRandomPis( p );
    // flop outputs
    if ( vInit )
    {
        assert( Vec_IntSize(vInit) == Saig_ManRegNum(p->pAig) * p->pPars->nWords );
        Saig_ManForEachLo( p->pAig, pObj, i )
        {
            pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
            for ( w = 0; w < p->pPars->nWords; w++ )
                pSim[w] = Vec_IntEntry(vInit, w * Saig_ManRegNum(p->pAig) + i) ? ~(word)0 : (word)0;
        }
    }
    else
    {
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
        {
            pSimLi = Ssw_RarObjSim( p, Aig_ObjId(pObjLi) );
            pSim   = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
            for ( w = 0; w < p->pPars->nWords; w++ )
                pSim[w] = pSimLi[w];
        }
    }
}